

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O3

double __thiscall despot::BaseTag::StepReward(BaseTag *this,Belief *belief,ACT_TYPE action)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  plVar3 = (long *)(**(code **)(*(long *)belief + 0x30))();
  lVar4 = plVar3[1] - *plVar3;
  if (lVar4 == 0) {
    dVar6 = 0.0;
  }
  else {
    lVar4 = lVar4 >> 3;
    dVar6 = 0.0;
    lVar5 = 0;
    do {
      lVar2 = *(long *)(*plVar3 + lVar5 * 8);
      dVar7 = -1.0;
      if ((action == 4) &&
         (iVar1 = *(int *)(lVar2 + 0xc), dVar7 = TAG_REWARD,
         (this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[iVar1] !=
         (this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[iVar1])) {
        dVar7 = -TAG_REWARD;
      }
      dVar6 = dVar6 + dVar7 * *(double *)(lVar2 + 0x18);
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  return dVar6;
}

Assistant:

double BaseTag::StepReward(const Belief* belief, ACT_TYPE action) const {
	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();

	double sum = 0;
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		TagState* state = static_cast<TagState*>(particle);
		double reward = 0;
		if (action == TagAction()) {
			if (rob_[state->state_id] == opp_[state->state_id]) {
				reward = TAG_REWARD;
			} else {
				reward = -TAG_REWARD;
			}
		} else {
			reward = -1;
		}
		sum += state->weight * reward;
	}

	return sum;
}